

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

RB90 * __thiscall amrex::FabArrayBase::getRB90(FabArrayBase *this,IntVect *nghost,Box *domain)

{
  const_iterator __position;
  bool bVar1;
  pointer ppVar2;
  RB90 *__x;
  Box *in_RDX;
  int *in_RSI;
  long in_RDI;
  RB90 *new_rb90;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_> it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
  er_it;
  key_type *in_stack_ffffffffffffff28;
  IntVect *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*> local_b0;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
  in_stack_ffffffffffffff68;
  IntVect *in_stack_ffffffffffffff70;
  FabArrayBase *in_stack_ffffffffffffff78;
  RB90 *in_stack_ffffffffffffff80;
  RB90 *pRVar3;
  _Self local_78;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
  local_70;
  Box *local_60;
  int *local_58;
  int *local_40;
  IntVect *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_60 = in_RDX;
  local_58 = in_RSI;
  local_70 = std::
             multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
             ::equal_range((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
                            *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_78._M_node = local_70.first._M_node;
  do {
    bVar1 = std::operator!=(&local_78,&local_70.second);
    if (!bVar1) {
      __x = (RB90 *)operator_new(0x48);
      RB90::RB90(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (Box *)in_stack_ffffffffffffff68._M_node);
      pRVar3 = __x;
      std::
      _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
      ::_Rb_tree_const_iterator
                ((_Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
                  *)&stack0xffffffffffffff68,&local_70.second);
      std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>::
      pair<amrex::FabArrayBase::BDKey_&,_amrex::FabArrayBase::RB90_*&,_true>
                (&local_b0,(BDKey *)(in_RDI + 0xd0),(RB90 **)&stack0xffffffffffffff80);
      __position._M_node._7_1_ = in_stack_ffffffffffffff3f;
      __position._M_node._0_7_ = in_stack_ffffffffffffff38;
      std::
      multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
      ::insert((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>_>
                *)in_stack_ffffffffffffff30,__position,(value_type *)__x);
      return pRVar3;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
                           *)0x1009b26);
    pRVar3 = ppVar2->second;
    in_stack_ffffffffffffff30 = &pRVar3->m_ngrow;
    local_40 = local_58;
    local_8 = local_58;
    local_c = 0;
    in_stack_ffffffffffffff3f = false;
    if (in_stack_ffffffffffffff30->vect[0] == *local_58) {
      local_18 = local_58;
      local_1c = 1;
      in_stack_ffffffffffffff3f = false;
      if ((pRVar3->m_ngrow).vect[1] == local_58[1]) {
        local_28 = local_58;
        local_2c = 2;
        in_stack_ffffffffffffff3f = (pRVar3->m_ngrow).vect[2] == local_58[2];
      }
    }
    local_38 = in_stack_ffffffffffffff30;
    if ((bool)in_stack_ffffffffffffff3f != false) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
                             *)0x1009c1a);
      bVar1 = Box::operator==(&ppVar2->second->m_domain,local_60);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
                               *)0x1009c3c);
        return ppVar2->second;
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>::
    operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::RB90_*>_>
                *)in_stack_ffffffffffffff30);
  } while( true );
}

Assistant:

const FabArrayBase::RB90&
FabArrayBase::getRB90 (const IntVect& nghost, const Box& domain) const
{
    BL_PROFILE("FabArrayBase::getRB90()");

    AMREX_ASSERT(getBDKey() == m_bdkey);
    auto er_it = m_TheRB90Cache.equal_range(m_bdkey);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_ngrow  == nghost &&
            it->second->m_domain == domain)
        {
            return *(it->second);
        }
    }

    RB90* new_rb90 = new RB90(*this, nghost, domain);
    m_TheRB90Cache.insert(er_it.second, RB90Cache::value_type(m_bdkey,new_rb90));

    return *new_rb90;
}